

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O3

void gimage::anon_unknown_17::loadTiledHeader
               (BasicImageIO *io,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *list,string *prefix,string *suffix,long *twidth,long *theight,long *tborder,
               long *width,long *height,int *depth)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  set *psVar3;
  istream *piVar4;
  _Rb_tree_node_base *p_Var5;
  IOException *pIVar6;
  uint uVar7;
  uint uVar8;
  int k;
  int i;
  Properties prop;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  char local_25b;
  char local_25a;
  char local_259;
  string *local_258;
  string *local_250;
  long *local_248;
  int local_23c;
  set *local_238;
  long *local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  BasicImageIO *local_1e8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  int aiStack_190 [22];
  ios_base local_138 [264];
  
  local_250 = suffix;
  local_238 = (set *)list;
  local_1e8 = io;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&list->_M_t);
  *twidth = 0;
  *theight = 0;
  *tborder = 0;
  *width = 0;
  *height = 0;
  *depth = 0;
  local_1e0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1e0._M_impl.super__Rb_tree_header._M_header;
  local_1e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1e0._M_impl.super__Rb_tree_header._M_node_count = 0;
  paVar1 = &local_1b0.field_2;
  pcVar2 = (prefix->_M_dataplus)._M_p;
  local_258 = prefix;
  local_248 = theight;
  local_230 = twidth;
  local_1e0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1e0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b0,pcVar2,pcVar2 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_1b0);
  gutil::Properties::load((char *)&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  pcVar2 = (local_258->_M_dataplus)._M_p;
  local_1b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b0,pcVar2,pcVar2 + local_258->_M_string_length);
  std::__cxx11::string::append((char *)&local_1b0);
  gutil::Properties::load((char *)&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  psVar3 = local_238;
  gutil::Properties::getValue<long>((Properties *)&local_1e0,"border",tborder,"0");
  gutil::getFileList(psVar3,(string *)local_258,(string *)local_250);
  if (*(long *)(psVar3 + 0x28) == 0) {
    pIVar6 = (IOException *)__cxa_allocate_exception(0x28);
    std::operator+(&local_208,"There are no tiles: ",local_258);
    std::operator+(&local_228,&local_208,':');
    std::operator+(&local_1b0,&local_228,local_250);
    gutil::IOException::IOException(pIVar6,&local_1b0);
    __cxa_throw(pIVar6,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  (*local_1e8->_vptr_BasicImageIO[4])
            (local_1e8,*(undefined8 *)(*(long *)(psVar3 + 0x18) + 0x20),local_230,theight,depth);
  p_Var5 = *(_Rb_tree_node_base **)(psVar3 + 0x18);
  if (p_Var5 != (_Rb_tree_node_base *)(psVar3 + 8)) {
    uVar8 = 0;
    uVar7 = 0;
    do {
      std::__cxx11::string::substr((ulong)&local_228,(ulong)(p_Var5 + 1));
      std::__cxx11::istringstream::istringstream
                ((istringstream *)&local_1b0,(string *)&local_228,_S_in);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p);
      }
      piVar4 = std::operator>>((istream *)&local_1b0,&local_259);
      piVar4 = (istream *)std::istream::operator>>((istream *)piVar4,&local_23c);
      piVar4 = std::operator>>(piVar4,&local_25a);
      piVar4 = (istream *)std::istream::operator>>((istream *)piVar4,(int *)&local_208);
      std::operator>>(piVar4,&local_25b);
      if ((((*(int *)((long)aiStack_190 + *(long *)(local_1b0._M_dataplus._M_p + -0x18)) == 0) &&
           (local_259 == '_')) && (local_25a == '_')) && (local_25b == '_')) {
        if ((int)uVar7 <= (int)((int)local_208._M_dataplus._M_p + 1U)) {
          uVar7 = (int)local_208._M_dataplus._M_p + 1U;
        }
        if ((int)uVar8 <= (int)(local_23c + 1U)) {
          uVar8 = local_23c + 1U;
        }
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)&local_1b0);
      std::ios_base::~ios_base(local_138);
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != (_Rb_tree_node_base *)(psVar3 + 8));
    if ((uVar7 != 0) && (uVar8 != 0)) {
      *width = (ulong)uVar7 * (*local_230 + *tborder * -2);
      *height = (ulong)uVar8 * (*local_248 + *tborder * -2);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1e0);
      return;
    }
  }
  pIVar6 = (IOException *)__cxa_allocate_exception(0x28);
  std::operator+(&local_208,"This is not a tiled image: ",local_258);
  std::operator+(&local_228,&local_208,':');
  std::operator+(&local_1b0,&local_228,local_250);
  gutil::IOException::IOException(pIVar6,&local_1b0);
  __cxa_throw(pIVar6,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void loadTiledHeader(const BasicImageIO &io, std::set<std::string> &list,
                     const std::string &prefix, const std::string &suffix, long &twidth, long &theight,
                     long &tborder, long &width, long &height, int &depth)
{
  // initialise return parameters

  list.clear();
  twidth=0;
  theight=0;
  tborder=0;
  width=0;
  height=0;
  depth=0;

  // get optional border size

  gutil::Properties prop;

  try
  {
    prop.load((prefix+".hdr").c_str());
  }
  catch (const std::exception &)
  { }

  try
  {
    prop.load((prefix+"_param.txt").c_str());
  }
  catch (const std::exception &)
  { }

  prop.getValue("border", tborder, "0");

  // get list of all tiles

  gutil::getFileList(list, prefix, suffix);

  if (list.empty())
  {
    throw gutil::IOException("There are no tiles: "+prefix+':'+suffix);
  }

  // load header information of first tile

  io.loadHeader((*list.begin()).c_str(), twidth, theight, depth);

  // determine number of rows and columns

  int rows=0;
  int cols=0;

  for (std::set<std::string>::iterator it=list.begin(); it!=list.end(); ++it)
  {
    int i, k;
    char sep1, sep2, sep3;
    std::istringstream in(it->substr(prefix.size(), it->size()-prefix.size()-suffix.size()));

    in >> sep1 >> k >> sep2 >> i >> sep3;

    if (in.good() && sep1 == '_' && sep2 == '_' && sep3 == '_')
    {
      cols=std::max(cols, i+1);
      rows=std::max(rows, k+1);
    }
  }

  if (cols == 0 || rows == 0)
  {
    throw gutil::IOException("This is not a tiled image: "+prefix+':'+suffix);
  }

  // compute total size

  width=(twidth-2*tborder)*cols;
  height=(theight-2*tborder)*rows;
}